

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O0

void __thiscall TPZInterpolationSpace::ShortPrint(TPZInterpolationSpace *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  ostream *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(in_RSI,
                           "virtual void TPZInterpolationSpace::ShortPrint(std::ostream &) const");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"PreferredSideOrder ");
  this_00 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x28));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZInterpolationSpace::ShortPrint(std::ostream &out) const {
    out << __PRETTY_FUNCTION__ << std::endl;
    out << "PreferredSideOrder " << fPreferredOrder << std::endl;
}